

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O0

void find_approximate_solution
               (double *G,double *V,Node_status *node_status,double *space_coordinates,
               Gas_parameters *gas_parameters,Grid *grid,
               Iterative_Method_parameters *iterative_method_parameters)

{
  double *rh_side_00;
  double *unknown_vector_00;
  double *__ptr;
  uint local_74;
  uint max_iterations;
  uint time_step;
  double *buffer;
  double *unknown_vector;
  double *rh_side;
  Sparse_matrix lh_side;
  Grid *grid_local;
  Gas_parameters *gas_parameters_local;
  double *space_coordinates_local;
  Node_status *node_status_local;
  double *V_local;
  double *G_local;
  
  lh_side._24_8_ = grid;
  rh_side_00 = (double *)malloc((ulong)(grid->X_nodes << 1) << 3);
  unknown_vector_00 = (double *)malloc((ulong)(uint)(*(int *)lh_side._24_8_ << 1) << 3);
  __ptr = (double *)malloc((ulong)(uint)(*(int *)lh_side._24_8_ * 0x14) << 3);
  Sparse_matrix_Construct(&rh_side,*(int *)lh_side._24_8_ << 1,*(int *)lh_side._24_8_ * 10 - 10);
  SetRTCAccuracy(iterative_method_parameters->accuracy);
  fill_unknown_vector(G,V,unknown_vector_00,*(uint *)lh_side._24_8_);
  for (local_74 = 1; local_74 < *(uint *)(lh_side._24_8_ + 4); local_74 = local_74 + 1) {
    print_info_about_current_iteration(local_74,(Grid *)lh_side._24_8_);
    fill_system((Sparse_matrix *)&rh_side,rh_side_00,(Grid *)lh_side._24_8_,node_status,
                gas_parameters,space_coordinates,local_74,G,V);
    if (iterative_method_parameters->implementation == Implementation_Native) {
      (*iterative_method_parameters->method)
                ((Sparse_matrix *)&rh_side,unknown_vector_00,rh_side_00,0x32,
                 iterative_method_parameters->preconditioner_type,
                 iterative_method_parameters->relaxation_constant,
                 iterative_method_parameters->accuracy,__ptr);
    }
    else {
      call_laspack_method(iterative_method_parameters->method_laspack,(Sparse_matrix *)&rh_side,
                          unknown_vector_00,rh_side_00,50.0,
                          iterative_method_parameters->preconditioner_type_laspack,
                          iterative_method_parameters->relaxation_constant);
    }
    fill_approximation(G,V,unknown_vector_00,*(uint *)lh_side._24_8_);
  }
  Sparse_matrix_Destruct(&rh_side);
  free(unknown_vector_00);
  free(rh_side_00);
  free(__ptr);
  return;
}

Assistant:

void find_approximate_solution (
    double * G, 
    double * V, 
    Node_status const * node_status, 
    double const * space_coordinates, 
    Gas_parameters const * gas_parameters,
    Grid const * grid,
    Iterative_Method_parameters const * iterative_method_parameters) {

  // left-hand side of the system
  Sparse_matrix lh_side; 
  // right-hand side of the system
  double * rh_side = NEW(double, 2 * grid->X_nodes); 
  // will be found when we solve the system
  double * unknown_vector = NEW(double, 2 * grid->X_nodes);
  // buffer used by iterative method
  double * buffer = NEW(double, 20 * grid->X_nodes);

  register unsigned time_step;

  unsigned const max_iterations = 50;
  Sparse_matrix_Construct (&lh_side, 2 * grid->X_nodes, 10 * grid->X_nodes - 10);

#ifndef NO_LASPACK
  // iterative algorithm accuracy
  SetRTCAccuracy (iterative_method_parameters->accuracy);
#endif /* NO_LASPACK */

  fill_unknown_vector (G, V, unknown_vector, grid->X_nodes); 

  for (time_step = 1; time_step < grid->T_nodes; ++time_step) {
    // this may slow things up
    print_info_about_current_iteration (time_step, grid);

    fill_system (&lh_side, rh_side, grid, node_status, gas_parameters, space_coordinates, time_step, G, V);

    // launch iteration algorithm
    if (iterative_method_parameters->implementation == Implementation_Native) {
      iterative_method_parameters->method (&lh_side,
              unknown_vector,
              rh_side,
              max_iterations,
              iterative_method_parameters->preconditioner_type,
              iterative_method_parameters->relaxation_constant,
              iterative_method_parameters->accuracy,
              buffer);
    }
#ifndef NO_LASPACK
    else {
      call_laspack_method (
              iterative_method_parameters->method_laspack,
              &lh_side,
              unknown_vector,
              rh_side,
              max_iterations,
              iterative_method_parameters->preconditioner_type_laspack,
              iterative_method_parameters->relaxation_constant);
    }
#endif /* NO_LASPACK */

    fill_approximation (G, V, unknown_vector, grid->X_nodes);
  }

  Sparse_matrix_Destruct (&lh_side);
  free (unknown_vector);
  free (rh_side);
  free (buffer);

  return;
}